

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

uchar __thiscall Map::GenerateNPCIndex(Map *this)

{
  pointer ppNVar1;
  pointer ppNVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar6;
  const_iterator __end1;
  pointer ppNVar7;
  bool bVar8;
  uchar uVar5;
  
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar5 = '\x01';
  uVar4 = '\x01';
  do {
    uVar6 = uVar4;
    uVar3 = uVar5;
    bVar8 = ppNVar1 == ppNVar2;
    if ((ppNVar1 != ppNVar2) &&
       (uVar6 = (*ppNVar1)->index + '\x01', uVar3 = uVar6, ppNVar7 = ppNVar1,
       (*ppNVar1)->index != uVar4)) {
      do {
        ppNVar7 = ppNVar7 + 1;
        bVar8 = ppNVar7 == ppNVar2;
        uVar6 = uVar5;
        uVar3 = uVar5;
        if (bVar8) break;
        uVar6 = (*ppNVar7)->index + '\x01';
        uVar3 = uVar6;
      } while ((*ppNVar7)->index != uVar5);
    }
    uVar5 = uVar3;
    uVar4 = uVar6;
    if (bVar8) {
      return uVar6;
    }
  } while( true );
}

Assistant:

unsigned char Map::GenerateNPCIndex() const
{
	unsigned char lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->npcs, npc)
	{
		if (npc->index == lowest_free_id)
		{
			lowest_free_id = npc->index + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}